

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrshift~.c
# Opt level: O2

t_int * rightshift_perform(t_int *w)

{
  t_int tVar1;
  undefined4 *puVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = w[1];
  puVar2 = (undefined4 *)w[2];
  iVar3 = (int)w[4];
  tVar1 = w[3];
  for (lVar5 = 0; puVar2 = puVar2 + -1, iVar3 - (int)tVar1 != (int)lVar5; lVar5 = lVar5 + -1) {
    *puVar2 = *(undefined4 *)(lVar4 + (long)iVar3 * -4 + -4 + lVar5 * 4);
  }
  for (lVar4 = 0; -iVar3 != (int)lVar4; lVar4 = lVar4 + -1) {
    puVar2[lVar4] = 0;
  }
  return w + 5;
}

Assistant:

static t_int *rightshift_perform(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_sample *out= (t_sample *)(w[2]);
    int n = (int)(w[3]);
    int shift = (int)(w[4]);
    n -= shift;
    in -= shift;
    while (n--)
        *--out = *--in;
    while (shift--)
        *--out = 0;
    return (w+5);
}